

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O1

bool embree::intersect_triangle_triangle(uint geomID0,uint primID0,uint geomID1,uint primID1)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vec3fa b2;
  Vec3fa b1;
  Vec3fa b0;
  Vec3fa a2;
  Vec3fa a1;
  Vec3fa a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  
  if (primID0 != primID1 || geomID0 != geomID1) {
    lVar2 = *(long *)(meshes + (ulong)geomID0 * 8);
    lVar3 = *(long *)(meshes + (ulong)geomID1 * 8);
    piVar8 = (int *)((ulong)primID0 * 0xc + *(long *)(lVar2 + 0x20));
    piVar7 = (int *)((ulong)primID1 * 0xc + *(long *)(lVar3 + 0x20));
    if (geomID0 != geomID1) {
LAB_00119e4a:
      puVar1 = (undefined8 *)(*(long *)(lVar2 + 8) + (long)*piVar8 * 0x10);
      local_18._0_8_ = *puVar1;
      local_18._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(*(long *)(lVar2 + 8) + (long)piVar8[1] * 0x10);
      local_28._0_8_ = *puVar1;
      local_28._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(*(long *)(lVar2 + 8) + (long)piVar8[2] * 0x10);
      local_38._0_8_ = *puVar1;
      local_38._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(*(long *)(lVar3 + 8) + (long)*piVar7 * 0x10);
      local_48._0_8_ = *puVar1;
      local_48._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(*(long *)(lVar3 + 8) + (long)piVar7[1] * 0x10);
      local_58._0_8_ = *puVar1;
      local_58._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(*(long *)(lVar3 + 8) + (long)piVar7[2] * 0x10);
      local_68._0_8_ = *puVar1;
      local_68._8_8_ = puVar1[1];
      bVar4 = sse2::TriangleTriangleIntersector::intersect_triangle_triangle
                        ((Vec3fa *)&local_18.field_1,(Vec3fa *)&local_28.field_1,
                         (Vec3fa *)&local_38.field_1,(Vec3fa *)&local_48.field_1,
                         (Vec3fa *)&local_58.field_1,(Vec3fa *)&local_68.field_1);
      return bVar4;
    }
    iVar6 = *piVar8;
    iVar10 = (int)((ulong)*(undefined8 *)(piVar8 + 1) >> 0x20);
    iVar9 = (int)*(undefined8 *)(piVar8 + 1);
    iVar5 = *piVar7;
    auVar11._0_4_ = -(uint)(iVar5 == iVar6);
    auVar11._4_4_ = -(uint)(iVar5 == iVar9);
    auVar11._8_4_ = -(uint)(iVar5 == iVar10);
    auVar11._12_4_ = -(uint)(iVar5 == iVar10);
    iVar5 = movmskps(primID1,auVar11);
    if (iVar5 == 0) {
      iVar5 = piVar7[1];
      auVar12._0_4_ = -(uint)(iVar5 == iVar6);
      auVar12._4_4_ = -(uint)(iVar5 == iVar9);
      auVar12._8_4_ = -(uint)(iVar5 == iVar10);
      auVar12._12_4_ = -(uint)(iVar5 == iVar10);
      iVar5 = movmskps(0,auVar12);
      if (iVar5 == 0) {
        iVar5 = piVar7[2];
        auVar13._0_4_ = -(uint)(iVar5 == iVar6);
        auVar13._4_4_ = -(uint)(iVar5 == iVar9);
        auVar13._8_4_ = -(uint)(iVar5 == iVar10);
        auVar13._12_4_ = -(uint)(iVar5 == iVar10);
        iVar6 = movmskps(0,auVar13);
        if (iVar6 == 0) goto LAB_00119e4a;
      }
    }
  }
  return false;
}

Assistant:

bool intersect_triangle_triangle (unsigned geomID0, unsigned primID0, unsigned geomID1, unsigned primID1)
{
  //CSTAT(bvh_collide_prim_intersections1++);
  
  /* special culling for scene intersection with itself */
  if (geomID0 == geomID1 && primID0 == primID1) {
    return false;
  }
  //CSTAT(bvh_collide_prim_intersections2++);

  auto mesh0 = meshes[geomID0].get ();
  auto mesh1 = meshes[geomID1].get ();
  auto const & tri0 = (Triangle&) mesh0->tris_[primID0];
  auto const & tri1 = (Triangle&) mesh1->tris_[primID1];
  
  if (geomID0 == geomID1)
  {
    /* ignore intersection with topological neighbors */
    const vint4 t0(tri0.v0,tri0.v1,tri0.v2,tri0.v2);
    if (any(vint4(tri1.v0) == t0)) return false;
    if (any(vint4(tri1.v1) == t0)) return false;
    if (any(vint4(tri1.v2) == t0)) return false;
  }
  //CSTAT(bvh_collide_prim_intersections3++);
  
  const Vec3fa a0 = mesh0->x_[tri0.v0];
  const Vec3fa a1 = mesh0->x_[tri0.v1];
  const Vec3fa a2 = mesh0->x_[tri0.v2];
  const Vec3fa b0 = mesh1->x_[tri1.v0];
  const Vec3fa b1 = mesh1->x_[tri1.v1];
  const Vec3fa b2 = mesh1->x_[tri1.v2];
  
  return isa::TriangleTriangleIntersector::intersect_triangle_triangle(a0,a1,a2,b0,b1,b2);
}